

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O0

void __thiscall
cmComputeComponentGraph::cmComputeComponentGraph(cmComputeComponentGraph *this,Graph *input)

{
  size_type __new_size;
  Graph *input_local;
  cmComputeComponentGraph *this_local;
  
  this->InputGraph = input;
  cmGraphAdjacencyList::cmGraphAdjacencyList(&this->ComponentGraph);
  std::vector<int,_std::allocator<int>_>::vector(&this->TarjanVisited);
  std::vector<int,_std::allocator<int>_>::vector(&this->TarjanComponents);
  std::
  vector<cmComputeComponentGraph::TarjanEntry,_std::allocator<cmComputeComponentGraph::TarjanEntry>_>
  ::vector(&this->TarjanEntries);
  std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::vector(&this->Components);
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,std::deque<int,std::allocator<int>>> *)&this->TarjanStack);
  Tarjan(this);
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&(this->ComponentGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>
             ,0);
  __new_size = std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::size
                         (&this->Components);
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&(this->ComponentGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>
             ,__new_size);
  TransferEdges(this);
  return;
}

Assistant:

cmComputeComponentGraph::cmComputeComponentGraph(Graph const& input)
  : InputGraph(input)
{
  // Identify components.
  this->Tarjan();

  // Compute the component graph.
  this->ComponentGraph.resize(0);
  this->ComponentGraph.resize(this->Components.size());
  this->TransferEdges();
}